

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::draw_hud(Application *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  reference pbVar4;
  long lVar5;
  int iVar6;
  float x;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float local_19c;
  float local_16c;
  ulong local_168;
  float z;
  float max_y;
  float max_x;
  float min_y;
  float min_x;
  string local_120;
  string local_100;
  string local_e0 [8];
  string s2;
  string s1;
  size_t split;
  string *s;
  iterator __end2;
  iterator __begin2;
  Info *__range2;
  Info selectionInfo;
  allocator<char> local_49;
  string local_48;
  float local_28;
  int local_24;
  float y;
  int inc;
  float y0;
  float x0;
  size_t size;
  Application *this_local;
  
  size = (size_t)this;
  OSDText::clear(&this->textManager);
  std::vector<int,_std::allocator<int>_>::clear(&this->messages);
  _y0 = 0x10;
  if (((this->super_Renderer).use_hdpi & 1U) == 0) {
    local_168 = this->screenW - 300;
  }
  else {
    local_168 = this->screenW - 600;
  }
  local_16c = (float)local_168;
  inc = (int)local_16c;
  iVar6 = 0x40;
  if (((this->super_Renderer).use_hdpi & 1U) != 0) {
    iVar6 = 0x80;
  }
  y = (float)iVar6;
  local_24 = 0x18;
  if (((this->super_Renderer).use_hdpi & 1U) != 0) {
    local_24 = 0x30;
  }
  local_28 = (y + (float)local_24) - 16.0;
  bVar3 = DynamicScene::Scene::has_selection(this->scene);
  iVar6 = inc;
  fVar7 = local_28;
  if (bVar3) {
    DynamicScene::Scene::getSelectionInfo_abi_cxx11_((Info *)&__range2,this->scene);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    s = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&s), bVar3) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      lVar5 = std::__cxx11::string::find_first_of((char *)pbVar4,0x2dea8c);
      iVar6 = inc;
      fVar7 = local_28;
      if (lVar5 == -1) {
        std::__cxx11::string::string((string *)&min_y,(string *)pbVar4);
        draw_string(this,(float)iVar6,fVar7,(string *)&min_y,0x10,&this->text_color);
        std::__cxx11::string::~string((string *)&min_y);
      }
      else {
        std::__cxx11::string::substr((ulong)((long)&s2.field_2 + 8),(ulong)pbVar4);
        std::__cxx11::string::substr((ulong)local_e0,(ulong)pbVar4);
        iVar6 = inc;
        fVar7 = local_28;
        std::__cxx11::string::string((string *)&local_100,(string *)(s2.field_2._M_local_buf + 8));
        draw_string(this,(float)iVar6,fVar7,&local_100,0x10,&this->text_color);
        std::__cxx11::string::~string((string *)&local_100);
        fVar7 = local_28;
        iVar6 = 0x4b;
        if (((this->super_Renderer).use_hdpi & 1U) != 0) {
          iVar6 = 0x96;
        }
        x = (float)inc + (float)iVar6;
        std::__cxx11::string::string((string *)&local_120,local_e0);
        draw_string(this,x,fVar7,&local_120,0x10,&this->text_color);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string((string *)(s2.field_2._M_local_buf + 8));
      }
      local_28 = (float)local_24 + local_28;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"No mesh feature is selected",&local_49);
    draw_string(this,(float)iVar6,fVar7,&local_48,0x10,&this->text_color);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    local_28 = (float)local_24 + local_28;
  }
  glPushAttrib(0x800);
  glViewport(0,0,(int)this->screenW,(int)this->screenH);
  glMatrixMode(0x1701);
  glPushMatrix();
  glLoadIdentity();
  sVar1 = this->screenW;
  auVar8._8_4_ = (int)(sVar1 >> 0x20);
  auVar8._0_8_ = sVar1;
  auVar8._12_4_ = 0x45300000;
  sVar2 = this->screenH;
  auVar9._8_4_ = (int)(sVar2 >> 0x20);
  auVar9._0_8_ = sVar2;
  auVar9._12_4_ = 0x45300000;
  glOrtho(0,(auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),
          (auVar9._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0),0,0,0x3ff0000000000000);
  glMatrixMode(0x1700);
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0);
  glColor4f(0);
  fVar7 = (float)inc - 32.0;
  local_19c = (float)this->screenW;
  glDisable(0xb71);
  glDisable(0xb50);
  glBegin(7);
  glVertex3f(fVar7);
  glVertex3f(fVar7);
  glVertex3f(local_19c);
  glVertex3f(local_19c);
  glEnd();
  glMatrixMode(0x1701);
  glPopMatrix();
  glMatrixMode(0x1700);
  glPopMatrix();
  glPopAttrib();
  glEnable(0xb50);
  glEnable(0xb71);
  OSDText::render(&this->textManager);
  return;
}

Assistant:

void Application::draw_hud() {
  textManager.clear();
  messages.clear();

  const size_t size = 16;
  const float x0 = use_hdpi ? screenW - 300 * 2 : screenW - 300;
  const float y0 = use_hdpi ? 128 : 64;
  const int inc  = use_hdpi ? 48  : 24;
  float y = y0 + inc - size;

  // No selection --> no messages.
  if (!scene->has_selection()) {
    draw_string(x0, y, "No mesh feature is selected", size, text_color);
    y += inc;
  } else {
    Info selectionInfo = scene->getSelectionInfo();
    for (const string& s : selectionInfo) {
      size_t split = s.find_first_of(":");
      if (split != string::npos) {
        split++;
        string s1 = s.substr(0,split);
        string s2 = s.substr(split);
        draw_string(x0, y, s1, size, text_color);
        draw_string(x0 + (use_hdpi ? 150 : 75 ), y, s2, size, text_color);
      } else {
        draw_string(x0, y, s, size, text_color);
      }
      y += inc;
    }
  }

  // -- First draw a lovely black rectangle.

  glPushAttrib(GL_VIEWPORT_BIT);
  glViewport(0, 0, screenW, screenH);

  glMatrixMode(GL_PROJECTION);
  glPushMatrix();
  glLoadIdentity();
  glOrtho(0, screenW, screenH, 0, 0, 1);

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0, 0, -1);

  // -- Black with opacity .8;

  glColor4f(0.0, 0.0, 0.0, 0.8);

  float min_x = x0 - 32;
  float min_y = y0 - 32;
  float max_x = screenW;
  float max_y = y;

  float z = 0.0;

  glDisable(GL_DEPTH_TEST);
  glDisable(GL_LIGHTING);

  glBegin(GL_QUADS);

  glVertex3f(min_x, min_y, z);
  glVertex3f(min_x, max_y, z);
  glVertex3f(max_x, max_y, z);
  glVertex3f(max_x, min_y, z);
  glEnd();

  glMatrixMode(GL_PROJECTION);
  glPopMatrix();

  glMatrixMode(GL_MODELVIEW);
  glPopMatrix();

  glPopAttrib();

  glEnable(GL_LIGHTING);
  glEnable(GL_DEPTH_TEST);

  textManager.render();
}